

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncPipe::abortRead(AsyncPipe *this)

{
  RefOrVoid<kj::AsyncIoStream> other;
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_68;
  undefined1 local_51;
  Own<kj::PromiseFulfiller<void>_> *local_50;
  Own<kj::PromiseFulfiller<void>_> *f;
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead> local_38;
  Own<kj::AsyncIoStream> local_28;
  AsyncIoStream *local_18;
  AsyncIoStream *s;
  AsyncPipe *this_local;
  
  s = &this->super_AsyncIoStream;
  local_18 = kj::_::readMaybe<kj::AsyncIoStream>(&this->state);
  if (local_18 == (AsyncIoStream *)0x0) {
    heap<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>();
    Own<kj::AsyncIoStream>::Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,void>
              (&local_28,&local_38);
    Own<kj::AsyncIoStream>::operator=(&this->ownState,&local_28);
    Own<kj::AsyncIoStream>::~Own(&local_28);
    Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::~Own(&local_38);
    other = Own<kj::AsyncIoStream>::operator*(&this->ownState);
    Maybe<kj::AsyncIoStream_&>::operator=(&this->state,other);
    this->readAborted = true;
    local_50 = kj::_::readMaybe<kj::PromiseFulfiller<void>>(&this->readAbortFulfiller);
    if (local_50 != (Own<kj::PromiseFulfiller<void>_> *)0x0) {
      pPVar1 = Own<kj::PromiseFulfiller<void>_>::get(local_50);
      (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_51);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_68,(void *)0x0);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=(&this->readAbortFulfiller,&local_68);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_68);
    }
  }
  else {
    (*(local_18->super_AsyncInputStream)._vptr_AsyncInputStream[5])();
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_MAYBE(s, state) {
      s->abortRead();
    } else {
      ownState = kj::heap<AbortedRead>();
      state = *ownState;

      readAborted = true;
      KJ_IF_MAYBE(f, readAbortFulfiller) {
        f->get()->fulfill();
        readAbortFulfiller = nullptr;
      }
    }